

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_locale.cpp
# Opt level: O3

wchar_t * __thiscall
ON_Locale::GetAppleLocaleName(ON_Locale *this,wchar_t *buffer,size_t buffer_capacity)

{
  char cVar1;
  char *pcVar2;
  wchar_t *pwVar3;
  char cbuffer [128];
  char acStack_a8 [136];
  
  pcVar2 = GetAppleLocaleName(this,acStack_a8,0x80);
  if (buffer != (wchar_t *)0x0 && buffer_capacity != 0) {
    memset(buffer,0,buffer_capacity * 4);
    if (pcVar2 != (char *)0x0) {
      pwVar3 = buffer;
      while (pwVar3 < buffer + buffer_capacity) {
        cVar1 = *pcVar2;
        pcVar2 = pcVar2 + 1;
        *pwVar3 = (int)cVar1;
        pwVar3 = pwVar3 + 1;
        if (cVar1 == '\0') {
          return buffer;
        }
      }
      memset(buffer,0,buffer_capacity * 4);
    }
  }
  return (wchar_t *)0x0;
}

Assistant:

const wchar_t* ON_Locale::GetAppleLocaleName(
  wchar_t* buffer,
  size_t buffer_capacity
  ) const
{
  char cbuffer[ON_Locale::BUFFER_MAXIMUM_CAPACITY];
  return (LocalWideStringBuider(
    GetAppleLocaleName(cbuffer,sizeof(cbuffer)/sizeof(cbuffer[0])),
    buffer,
    buffer_capacity
    ));
}